

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filenames.c
# Opt level: O0

void test_filename(char *prefix,int dlen,int flen)

{
  size_t sVar1;
  archive_entry *paVar2;
  archive_entry *paVar3;
  archive_entry *paVar4;
  archive *v2;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  int i;
  int separator;
  size_t used;
  archive *a;
  archive_entry *ae;
  char dirname [400];
  char filename [400];
  char buff [8192];
  archive_entry *in_stack_ffffffffffffdc78;
  undefined4 in_stack_ffffffffffffdc80;
  uint in_stack_ffffffffffffdc84;
  wchar_t in_stack_ffffffffffffdc88;
  wchar_t in_stack_ffffffffffffdc8c;
  char *in_stack_ffffffffffffdc90;
  archive *in_stack_ffffffffffffdc98;
  undefined8 in_stack_ffffffffffffdca0;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *in_stack_ffffffffffffdcb0;
  wchar_t in_stack_ffffffffffffdcc8;
  char local_21a8 [8600];
  uint local_10;
  uint local_c;
  char *local_8;
  
  wVar5 = (wchar_t)((ulong)in_stack_ffffffffffffdca0 >> 0x20);
  iVar8 = 0;
  iVar6 = 0;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_RDI != (char *)0x0) {
    local_8 = in_RDI;
    strcpy(local_21a8,in_RDI);
    sVar1 = strlen(local_8);
    iVar6 = (int)sVar1;
  }
  iVar7 = iVar6;
  if (0 < (int)local_c) {
    for (; iVar7 < (int)local_c; iVar7 = iVar7 + 1) {
      local_21a8[iVar7] = 'a';
    }
    iVar6 = iVar7 + 1;
    local_21a8[iVar7] = '/';
    iVar8 = 1;
  }
  for (; iVar6 < (int)(local_c + local_10 + iVar8); iVar6 = iVar6 + 1) {
    local_21a8[iVar6] = 'b';
  }
  local_21a8[iVar6] = '\0';
  strcpy(&stack0xffffffffffffdcc8,local_21a8);
  paVar2 = (archive_entry *)archive_write_new();
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88));
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  archive_write_add_filter_none((archive *)paVar2);
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  archive_write_set_bytes_per_block
            ((archive *)CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
             in_stack_ffffffffffffdc84);
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  archive_write_open_memory
            (in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90,
             CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
             (size_t *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80));
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  paVar3 = archive_entry_new();
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                   in_stack_ffffffffffffdc78);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
             (char *)in_stack_ffffffffffffdc78);
  archive_entry_set_mode(paVar3,0x81ed);
  failure("dlen=%d, flen=%d",(ulong)local_c,(ulong)local_10);
  paVar3 = paVar2;
  if ((int)local_10 < 0x65) {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
               in_stack_ffffffffffffdc78);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1cc8fb,in_stack_ffffffffffffdcb0);
  }
  else {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
               in_stack_ffffffffffffdc78);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1cc8bb,in_stack_ffffffffffffdcb0);
  }
  archive_entry_free((archive_entry *)0x1cc905);
  paVar4 = archive_entry_new();
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar3);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
             (char *)paVar3);
  archive_entry_set_mode(paVar4,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)local_c,(ulong)local_10);
  paVar4 = paVar2;
  if ((int)local_10 < 100) {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar3);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1cc9fd,in_stack_ffffffffffffdcb0);
  }
  else {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar3);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1cc9bd,in_stack_ffffffffffffdcb0);
  }
  archive_entry_free((archive_entry *)0x1cca07);
  strcat(&stack0xffffffffffffdcc8,"/");
  paVar3 = archive_entry_new();
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar4);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
             (char *)paVar4);
  archive_entry_set_mode(paVar3,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)local_c,(ulong)local_10);
  if ((int)local_10 < 100) {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar4);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1ccb10,in_stack_ffffffffffffdcb0);
  }
  else {
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar4);
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                        (longlong)paVar2,(char *)0x1ccad0,in_stack_ffffffffffffdcb0);
  }
  archive_entry_free((archive_entry *)0x1ccb1a);
  archive_write_close((archive *)0x1ccb24);
  assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                      (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                      (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                      (longlong)paVar2,(char *)0x1ccb53,in_stack_ffffffffffffdcb0);
  archive_write_free((archive *)0x1ccb5d);
  paVar2 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                      (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                      (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),0,
                      (char *)0x1ccb8b,in_stack_ffffffffffffdcb0);
  v2 = archive_read_new();
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
  archive_read_support_format_all((archive *)paVar2);
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
  archive_read_support_filter_all((archive *)paVar2);
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2,
             0x1ccc3f);
  assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                   (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
  if ((int)local_10 < 0x65) {
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
               (archive_entry **)paVar2);
    assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                     (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
    failure("dlen=%d, flen=%d",(ulong)local_c,(ulong)local_10);
    wVar5 = (wchar_t)((ulong)local_21a8 >> 0x20);
    archive_entry_pathname(paVar2);
    in_stack_ffffffffffffdc80 = 0;
    assertion_equal_string
              ((char *)CONCAT44(iVar8,iVar6),wVar5,(char *)in_stack_ffffffffffffdc98,
               in_stack_ffffffffffffdc90,
               (char *)CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
               (char *)((ulong)in_stack_ffffffffffffdc84 << 0x20),paVar3,in_stack_ffffffffffffdcc8);
    archive_entry_mode(paVar3);
    paVar2 = (archive_entry *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffdc98,
                        (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                        (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),0,
                        (char *)0x1ccd5d,in_stack_ffffffffffffdcb0);
  }
  if ((int)local_10 < 100) {
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
               (archive_entry **)paVar2);
    assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                     (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
    archive_entry_mode(paVar3);
    assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                     (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
    failure("dlen=%d, flen=%d",(ulong)local_c,(ulong)local_10);
    in_stack_ffffffffffffdc98 = (archive *)&stack0xffffffffffffdcc8;
    archive_entry_pathname(paVar2);
    paVar2 = (archive_entry *)0x0;
    in_stack_ffffffffffffdc80 = 0;
    assertion_equal_string
              ((char *)CONCAT44(iVar8,iVar6),wVar5,(char *)in_stack_ffffffffffffdc98,
               in_stack_ffffffffffffdc90,
               (char *)CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
               (char *)((ulong)in_stack_ffffffffffffdc84 << 0x20),paVar3,in_stack_ffffffffffffdcc8);
  }
  if ((int)local_10 < 100) {
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
               (archive_entry **)paVar2);
    assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                     (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
    archive_entry_mode(paVar3);
    assertion_assert(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88,
                     (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),paVar2);
    in_stack_ffffffffffffdc90 = &stack0xffffffffffffdcc8;
    archive_entry_pathname(paVar2);
    paVar2 = (archive_entry *)0x0;
    in_stack_ffffffffffffdc80 = 0;
    assertion_equal_string
              ((char *)CONCAT44(iVar8,iVar6),wVar5,(char *)in_stack_ffffffffffffdc98,
               in_stack_ffffffffffffdc90,
               (char *)CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
               (char *)((ulong)in_stack_ffffffffffffdc84 << 0x20),paVar3,in_stack_ffffffffffffdcc8);
  }
  wVar5 = (wchar_t)((ulong)in_stack_ffffffffffffdc90 >> 0x20);
  failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d",
          (ulong)local_c,(ulong)local_10);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
             (archive_entry **)paVar2);
  assertion_equal_int((char *)in_stack_ffffffffffffdc98,wVar5,
                      CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                      (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),0,
                      (char *)0x1ccf73,in_stack_ffffffffffffdcb0);
  archive_read_close((archive *)0x1ccf7d);
  assertion_equal_int((char *)in_stack_ffffffffffffdc98,wVar5,
                      CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                      (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),
                      (longlong)v2,(char *)0x1ccfac,in_stack_ffffffffffffdcb0);
  archive_read_free((archive *)0x1ccfb6);
  assertion_equal_int((char *)in_stack_ffffffffffffdc98,wVar5,
                      CONCAT44(in_stack_ffffffffffffdc8c,in_stack_ffffffffffffdc88),
                      (char *)CONCAT44(in_stack_ffffffffffffdc84,in_stack_ffffffffffffdc80),0,
                      (char *)0x1ccfe4,in_stack_ffffffffffffdcb0);
  return;
}

Assistant:

static void
test_filename(const char *prefix, int dlen, int flen)
{
	char buff[8192];
	char filename[400];
	char dirname[400];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int separator = 0;
	int i = 0;

	if (prefix != NULL) {
		strcpy(filename, prefix);
		i = (int)strlen(prefix);
	}
	if (dlen > 0) {
		for (; i < dlen; i++)
			filename[i] = 'a';
		filename[i++] = '/';
		separator = 1;
	}
	for (; i < dlen + flen + separator; i++)
		filename[i] = 'b';
	filename[i] = '\0';

	strcpy(dirname, filename);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a,0));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, filename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen > 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/*
	 * Write a dir to it (without trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Tar adds a '/' to directory names. */
	strcat(dirname, "/");

	/*
	 * Write a dir to it (with trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	if (flen <= 100) {
		/* Read the file and check the filename. */
		assertA(0 == archive_read_next_header(a, &ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(filename, archive_entry_pathname(ae));
		assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));
	}

	/*
	 * Read the two dirs and check the names.
	 *
	 * Both dirs should read back with the same name, since
	 * tar should add a trailing '/' to any dir that doesn't
	 * already have one.
	 */
	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	/* Verify the end of the archive. */
	failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d", dlen, flen);
	assertEqualInt(1, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}